

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O1

void DefaultExtension(char *path,char *extension)

{
  size_t sVar1;
  
  sVar1 = strlen(path);
  do {
    sVar1 = sVar1 - 1;
    if (sVar1 == 0) break;
    if (path[sVar1] == '.') {
      return;
    }
  } while (path[sVar1] != '/');
  strcat(path,extension);
  return;
}

Assistant:

void DefaultExtension (char *path, const char *extension)
{
	char *src;
//
// if path doesn't have a .EXT, append extension
// (extension should include the .)
//
	src = path + strlen(path) - 1;

	while (src != path && !IsSeperator(*src))
	{
		if (*src == '.')
			return;                 // it has an extension
		src--;
	}

	strcat (path, extension);
}